

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

pcp_errno build_pcp_options(pcp_flow_t *flow,void *cur)

{
  void *local_18;
  void *cur_local;
  pcp_flow_t *flow_local;
  
  local_18 = cur;
  if (flow->flowp_option_present != '\0') {
    local_18 = add_flowp_option(flow,cur);
  }
  if (flow->filter_option_present != '\0') {
    local_18 = add_filter_option(flow,local_18);
  }
  if (flow->pfailure_option_present != '\0') {
    local_18 = add_prefer_failure_option(local_18);
  }
  if (flow->third_party_option_present != '\0') {
    local_18 = add_third_party_option(flow,local_18);
  }
  if ((flow->f_deviceid).deviceid[0] != '\0') {
    local_18 = add_deviceid_option(flow,local_18);
  }
  if ((flow->f_userid).userid[0] != '\0') {
    local_18 = add_userid_option(flow,local_18);
  }
  if ((flow->f_location).location[0] != '\0') {
    local_18 = add_location_option(flow,local_18);
  }
  if (flow->md_val_count != 0) {
    local_18 = add_md_options(flow,local_18);
  }
  flow->pcp_msg_len = (int)local_18 - (int)flow->pcp_msg_buffer;
  return PCP_ERR_SUCCESS;
}

Assistant:

static pcp_errno build_pcp_options(pcp_flow_t *flow, void *cur) {
#ifdef PCP_FLOW_PRIORITY
    if (flow->flowp_option_present) {
        cur = add_flowp_option(flow, cur);
    }
#endif
    if (flow->filter_option_present) {
        cur = add_filter_option(flow, cur);
    }

    if (flow->pfailure_option_present) {
        cur = add_prefer_failure_option(cur);
    }
    if (flow->third_party_option_present) {
        cur = add_third_party_option(flow, cur);
    }
#ifdef PCP_EXPERIMENTAL
    if (flow->f_deviceid.deviceid[0] != '\0') {
        cur = add_deviceid_option(flow, cur);
    }

    if (flow->f_userid.userid[0] != '\0') {
        cur = add_userid_option(flow, cur);
    }

    if (flow->f_location.location[0] != '\0') {
        cur = add_location_option(flow, cur);
    }

    if (flow->md_val_count > 0) {
        cur = add_md_options(flow, cur);
    }
#endif

    flow->pcp_msg_len = ((char *)cur) - flow->pcp_msg_buffer;

    // TODO: implement building all pcp options into msg
    return PCP_ERR_SUCCESS;
}